

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-dis.c
# Opt level: O0

void atombf_d(disctx *ctx,ull *a,ull *m,void *v)

{
  int iVar1;
  ull num;
  ull uVar2;
  easm_expr *peVar3;
  easm_expr *e2;
  litem **pplVar4;
  litem *plVar5;
  easm_expr *expr;
  uint64_t num2;
  uint64_t num1;
  bitfield *bf;
  void *v_local;
  ull *m_local;
  ull *a_local;
  disctx *ctx_local;
  
  num = getbf((bitfield *)v,a,m);
  uVar2 = getbf((bitfield *)((long)v + 0x30),a,m);
  peVar3 = easm_expr_num(EASM_EXPR_NUM,num);
  e2 = easm_expr_num(EASM_EXPR_NUM,num + uVar2);
  peVar3 = easm_expr_bin(EASM_EXPR_VEC,peVar3,e2);
  if (ctx->atomsmax <= ctx->atomsnum) {
    if (ctx->atomsmax == 0) {
      ctx->atomsmax = 0x10;
    }
    else {
      ctx->atomsmax = ctx->atomsmax << 1;
    }
    pplVar4 = (litem **)realloc(ctx->atoms,(long)ctx->atomsmax << 3);
    ctx->atoms = pplVar4;
  }
  plVar5 = makeli(peVar3);
  iVar1 = ctx->atomsnum;
  ctx->atomsnum = iVar1 + 1;
  ctx->atoms[iVar1] = plVar5;
  return;
}

Assistant:

void atombf_d DPROTO {
	const struct bitfield *bf = v;
	uint64_t num1 = GETBF(&bf[0]);
	uint64_t num2 = num1 + GETBF(&bf[1]);
	struct easm_expr *expr = easm_expr_bin(EASM_EXPR_VEC,
			easm_expr_num(EASM_EXPR_NUM, num1),
			easm_expr_num(EASM_EXPR_NUM, num2));
	ADDARRAY(ctx->atoms, makeli(expr));
}